

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderStateQueryTests::init(ShaderStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  PrecisionFormatCase *pPVar2;
  ShaderStateQueryTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::ShaderTypeCase::ShaderTypeCase
            ((ShaderTypeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"shader_type",
             "SHADER_TYPE");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::ShaderCompileStatusCase::ShaderCompileStatusCase
            ((ShaderCompileStatusCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "shader_compile_status","COMPILE_STATUS");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::ShaderInfoLogCase::ShaderInfoLogCase
            ((ShaderInfoLogCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "shader_info_log_length","INFO_LOG_LENGTH");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::ShaderSourceCase::ShaderSourceCase
            ((ShaderSourceCase *)pTVar1,(this->super_TestCaseGroup).m_context,"shader_source_length"
             ,"SHADER_SOURCE_LENGTH");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::DeleteStatusCase::DeleteStatusCase
            ((DeleteStatusCase *)pTVar1,(this->super_TestCaseGroup).m_context,"delete_status",
             "DELETE_STATUS");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::CurrentVertexAttribInitialCase::CurrentVertexAttribInitialCase
            ((CurrentVertexAttribInitialCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "current_vertex_attrib_initial","CURRENT_VERTEX_ATTRIB");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::CurrentVertexAttribFloatCase::CurrentVertexAttribFloatCase
            ((CurrentVertexAttribFloatCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "current_vertex_attrib_float","CURRENT_VERTEX_ATTRIB");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::CurrentVertexAttribConversionCase::CurrentVertexAttribConversionCase
            ((CurrentVertexAttribConversionCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "current_vertex_attrib_float_to_int","CURRENT_VERTEX_ATTRIB");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::ProgramInfoLogCase::ProgramInfoLogCase
            ((ProgramInfoLogCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "program_info_log_length","INFO_LOG_LENGTH");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::ProgramValidateStatusCase::ProgramValidateStatusCase
            ((ProgramValidateStatusCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "program_validate_status","VALIDATE_STATUS");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::ProgramAttachedShadersCase::ProgramAttachedShadersCase
            ((ProgramAttachedShadersCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "program_attached_shaders","ATTACHED_SHADERS");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::ProgramActiveUniformNameCase::ProgramActiveUniformNameCase
            ((ProgramActiveUniformNameCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "program_active_uniform_name","ACTIVE_UNIFORMS and ACTIVE_UNIFORM_MAX_LENGTH");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::ProgramUniformCase::ProgramUniformCase
            ((ProgramUniformCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "program_active_uniform_types","UNIFORM_TYPE and UNIFORM_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::ActiveAttributesCase::ActiveAttributesCase
            ((ActiveAttributesCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "active_attributes","ACTIVE_ATTRIBUTES and ACTIVE_ATTRIBUTE_MAX_LENGTH");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::VertexAttributeSizeCase::VertexAttributeSizeCase
            ((VertexAttributeSizeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "vertex_attrib_size","VERTEX_ATTRIB_ARRAY_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::VertexAttributeTypeCase::VertexAttributeTypeCase
            ((VertexAttributeTypeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "vertex_attrib_type","VERTEX_ATTRIB_ARRAY_TYPE");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::VertexAttributeStrideCase::VertexAttributeStrideCase
            ((VertexAttributeStrideCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "vertex_attrib_stride","VERTEX_ATTRIB_ARRAY_STRIDE");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::VertexAttributeNormalizedCase::VertexAttributeNormalizedCase
            ((VertexAttributeNormalizedCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "vertex_attrib_normalized","VERTEX_ATTRIB_ARRAY_NORMALIZED");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::VertexAttributeEnabledCase::VertexAttributeEnabledCase
            ((VertexAttributeEnabledCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "vertex_attrib_array_enabled","VERTEX_ATTRIB_ARRAY_ENABLED");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::VertexAttributeBufferBindingCase::VertexAttributeBufferBindingCase
            ((VertexAttributeBufferBindingCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "vertex_attrib_array_buffer_binding","VERTEX_ATTRIB_ARRAY_BUFFER_BINDING");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::VertexAttributePointerCase::VertexAttributePointerCase
            ((VertexAttributePointerCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "vertex_attrib_pointerv","GetVertexAttribPointerv");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::UniformValueFloatCase::UniformValueFloatCase
            ((UniformValueFloatCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform_value_float","GetUniform*");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::UniformValueIntCase::UniformValueIntCase
            ((UniformValueIntCase *)pTVar1,(this->super_TestCaseGroup).m_context,"uniform_value_int"
             ,"GetUniform*");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::UniformValueBooleanCase::UniformValueBooleanCase
            ((UniformValueBooleanCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform_value_boolean","GetUniform*");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::UniformValueSamplerCase::UniformValueSamplerCase
            ((UniformValueSamplerCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform_value_sampler","GetUniform*");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::UniformValueArrayCase::UniformValueArrayCase
            ((UniformValueArrayCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform_value_array","GetUniform*");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  Functional::anon_unknown_0::UniformValueMatrixCase::UniformValueMatrixCase
            ((UniformValueMatrixCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "uniform_value_matrix","GetUniform*");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_lowp_float",
             "GetShaderPrecisionFormat",0x8b31,0x8df0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_mediump_float",
             "GetShaderPrecisionFormat",0x8b31,0x8df1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_highp_float",
             "GetShaderPrecisionFormat",0x8b31,0x8df2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_lowp_int",
             "GetShaderPrecisionFormat",0x8b31,0x8df3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_mediump_int",
             "GetShaderPrecisionFormat",0x8b31,0x8df4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_highp_int",
             "GetShaderPrecisionFormat",0x8b31,0x8df5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_lowp_float",
             "GetShaderPrecisionFormat",0x8b30,0x8df0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_mediump_float",
             "GetShaderPrecisionFormat",0x8b30,0x8df1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_highp_float",
             "GetShaderPrecisionFormat",0x8b30,0x8df2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_lowp_int",
             "GetShaderPrecisionFormat",0x8b30,0x8df3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_mediump_int",
             "GetShaderPrecisionFormat",0x8b30,0x8df4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_highp_int",
             "GetShaderPrecisionFormat",0x8b30,0x8df5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  return extraout_EAX;
}

Assistant:

void ShaderStateQueryTests::init (void)
{
	// shader
	addChild(new ShaderTypeCase						(m_context, "shader_type",							"SHADER_TYPE"));
	addChild(new ShaderCompileStatusCase			(m_context, "shader_compile_status",				"COMPILE_STATUS"));
	addChild(new ShaderInfoLogCase					(m_context, "shader_info_log_length",				"INFO_LOG_LENGTH"));
	addChild(new ShaderSourceCase					(m_context, "shader_source_length",					"SHADER_SOURCE_LENGTH"));

	// shader and program
	addChild(new DeleteStatusCase					(m_context, "delete_status",						"DELETE_STATUS"));

	// vertex-attrib
	addChild(new CurrentVertexAttribInitialCase		(m_context, "current_vertex_attrib_initial",		"CURRENT_VERTEX_ATTRIB"));
	addChild(new CurrentVertexAttribFloatCase		(m_context, "current_vertex_attrib_float",			"CURRENT_VERTEX_ATTRIB"));
	addChild(new CurrentVertexAttribConversionCase	(m_context, "current_vertex_attrib_float_to_int",	"CURRENT_VERTEX_ATTRIB"));

	// program
	addChild(new ProgramInfoLogCase					(m_context, "program_info_log_length",				"INFO_LOG_LENGTH"));
	addChild(new ProgramValidateStatusCase			(m_context, "program_validate_status",				"VALIDATE_STATUS"));
	addChild(new ProgramAttachedShadersCase			(m_context, "program_attached_shaders",				"ATTACHED_SHADERS"));

	addChild(new ProgramActiveUniformNameCase		(m_context, "program_active_uniform_name",			"ACTIVE_UNIFORMS and ACTIVE_UNIFORM_MAX_LENGTH"));
	addChild(new ProgramUniformCase					(m_context, "program_active_uniform_types",			"UNIFORM_TYPE and UNIFORM_SIZE"));

	// attribute related
	addChild(new ActiveAttributesCase				(m_context, "active_attributes",					"ACTIVE_ATTRIBUTES and ACTIVE_ATTRIBUTE_MAX_LENGTH"));
	addChild(new VertexAttributeSizeCase			(m_context, "vertex_attrib_size",					"VERTEX_ATTRIB_ARRAY_SIZE"));
	addChild(new VertexAttributeTypeCase			(m_context, "vertex_attrib_type",					"VERTEX_ATTRIB_ARRAY_TYPE"));
	addChild(new VertexAttributeStrideCase			(m_context, "vertex_attrib_stride",					"VERTEX_ATTRIB_ARRAY_STRIDE"));
	addChild(new VertexAttributeNormalizedCase		(m_context, "vertex_attrib_normalized",				"VERTEX_ATTRIB_ARRAY_NORMALIZED"));
	addChild(new VertexAttributeEnabledCase			(m_context, "vertex_attrib_array_enabled",			"VERTEX_ATTRIB_ARRAY_ENABLED"));
	addChild(new VertexAttributeBufferBindingCase	(m_context, "vertex_attrib_array_buffer_binding",	"VERTEX_ATTRIB_ARRAY_BUFFER_BINDING"));
	addChild(new VertexAttributePointerCase			(m_context, "vertex_attrib_pointerv",				"GetVertexAttribPointerv"));

	// uniform values
	addChild(new UniformValueFloatCase				(m_context, "uniform_value_float",					"GetUniform*"));
	addChild(new UniformValueIntCase				(m_context, "uniform_value_int",					"GetUniform*"));
	addChild(new UniformValueBooleanCase			(m_context, "uniform_value_boolean",				"GetUniform*"));
	addChild(new UniformValueSamplerCase			(m_context, "uniform_value_sampler",				"GetUniform*"));
	addChild(new UniformValueArrayCase				(m_context, "uniform_value_array",					"GetUniform*"));
	addChild(new UniformValueMatrixCase				(m_context, "uniform_value_matrix",					"GetUniform*"));

	// precision format query
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_lowp_float",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_LOW_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_mediump_float",		"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_MEDIUM_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_highp_float",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_HIGH_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_lowp_int",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_LOW_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_mediump_int",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_MEDIUM_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_highp_int",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_HIGH_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_lowp_float",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_LOW_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_mediump_float",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_MEDIUM_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_highp_float",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_HIGH_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_lowp_int",			"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_LOW_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_mediump_int",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_MEDIUM_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_highp_int",			"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_HIGH_INT));
}